

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O0

bool ImGui::ImageButton(RenderTexture *texture,int framePadding,Color *bgColor,Color *tintColor)

{
  bool bVar1;
  uint extraout_var;
  Vector2<unsigned_int> local_38;
  Vector2<float> local_30;
  Color *local_28;
  Color *tintColor_local;
  Color *bgColor_local;
  RenderTexture *pRStack_10;
  int framePadding_local;
  RenderTexture *texture_local;
  
  local_28 = tintColor;
  tintColor_local = bgColor;
  bgColor_local._4_4_ = framePadding;
  pRStack_10 = texture;
  local_38.x = (*(texture->super_RenderTarget)._vptr_RenderTarget[2])();
  local_38.y = extraout_var;
  sf::Vector2<float>::Vector2<unsigned_int>(&local_30,&local_38);
  bVar1 = ImageButton(texture,&local_30,bgColor_local._4_4_,tintColor_local,local_28);
  return bVar1;
}

Assistant:

bool ImageButton(const sf::RenderTexture& texture, const int framePadding, const sf::Color& bgColor,
                 const sf::Color& tintColor) {
    return ImageButton(texture, static_cast<sf::Vector2f>(texture.getSize()), framePadding, bgColor,
                       tintColor);
}